

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v8::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t divisor;
  result rVar3;
  int iVar4;
  ulong uVar5;
  detail *pdVar6;
  decimal_fp<float> dVar7;
  format_error *this;
  byte bVar8;
  undefined1 is_predecessor_closer;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  char cVar17;
  uint uVar18;
  long lVar19;
  long *plVar20;
  uint64_t error;
  size_t sVar21;
  ulong uVar22;
  float fVar23;
  decimal_fp<double> dVar24;
  fp value_00;
  gen_digits_handler handler;
  undefined4 in_stack_ffffffffffffff58;
  gen_digits_handler local_90;
  ulong local_78;
  uint local_6c;
  buffer<char> *local_68;
  uint64_t local_60;
  ulong local_58;
  detail *local_50;
  ulong local_48;
  detail *local_40;
  ulong local_38;
  
  uVar5 = (ulong)specs & 0xff00000000;
  local_90.fixed = uVar5 == 0x200000000;
  if (value <= 0.0) {
    if (0 < precision && uVar5 == 0x200000000) {
      uVar16 = (ulong)(uint)precision;
      uVar5 = buf->capacity_;
      if (uVar5 < uVar16) {
        (**buf->_vptr_buffer)(buf,uVar16);
        uVar5 = buf->capacity_;
      }
      if (uVar16 <= uVar5) {
        uVar5 = uVar16;
      }
      buf->size_ = uVar5;
      memset(buf->ptr_,0x30,uVar16);
      return -precision;
    }
    sVar21 = buf->size_;
    uVar5 = sVar21 + 1;
    if (buf->capacity_ < uVar5) {
      (**buf->_vptr_buffer)(buf);
      sVar21 = buf->size_;
      uVar5 = sVar21 + 1;
    }
    buf->size_ = uVar5;
    buf->ptr_[sVar21] = '0';
    return 0;
  }
  local_78 = (ulong)specs >> 0x20;
  uVar9 = specs._4_4_;
  if ((uVar9 >> 0x13 & 1) != 0) {
    iVar4 = snprintf_float<double>(value,precision,specs,buf);
    return iVar4;
  }
  if (precision < 0) {
    if ((uVar9 >> 0x12 & 1) == 0) {
      dVar24 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v8::appender,_unsigned_long,_0>((appender)buf,dVar24.significand);
      return dVar24.exponent;
    }
    dVar7 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,dVar7.significand);
    return dVar7.exponent;
  }
  local_50 = (detail *)((ulong)value & 0xfffffffffffff);
  uVar14 = (uint)((ulong)value >> 0x34) & 0x7ff;
  local_48 = (ulong)uVar14;
  pdVar6 = local_50 + 0x10000000000000;
  local_40 = pdVar6;
  if (uVar14 == 0) {
    local_40 = local_50;
  }
  uVar18 = uVar14 - 0x433;
  local_6c = uVar18;
  if (uVar14 == 0) {
    lVar19 = 0x3f;
    if (local_50 != (detail *)0x0) {
      for (; (ulong)local_50 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    pdVar6 = (detail *)((long)local_50 << (~(byte)lVar19 + 0x35 & 0x3f));
    uVar18 = ((uint)lVar19 ^ 0xffffffc0) - 0x426;
    local_6c = 0xfffffbce;
  }
  iVar4 = (int)((ulong)((long)(int)(-0x32 - uVar18) * 0x4d104d42 + 0xffffffff) >> 0x20);
  uVar10 = iVar4 + 0x15b;
  uVar14 = iVar4 + 0x162;
  if (-1 < (int)uVar10) {
    uVar14 = uVar10;
  }
  local_38 = (ulong)(uVar14 & 0xfffffff8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)pdVar6 << 0xb;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(basic_impl_data<void>::pow10_significands +
                           (long)((int)uVar14 >> 3) * 8 + 8);
  uVar22 = SUB168(auVar1 * auVar2,8) - (SUB168(auVar1 * auVar2,0) >> 0x3f);
  bVar8 = -((char)*(undefined2 *)
                   (basic_impl_data<void>::pow10_exponents + (long)((int)uVar14 >> 3) * 2 + 2) +
           (char)uVar18) - 0x35;
  local_90.exp10 = 0x154 - (uVar14 & 0xfffffff8);
  local_60 = 1L << (bVar8 & 0x3f);
  uVar16 = uVar22 >> (bVar8 & 0x3f);
  uVar18 = (uint)uVar16 | 1;
  uVar14 = 0x1f;
  if (uVar18 != 0) {
    for (; uVar18 >> uVar14 == 0; uVar14 = uVar14 - 1) {
    }
  }
  uVar12 = (uVar16 & 0xffffffff) +
           *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar14 * 8);
  uVar15 = uVar12 >> 0x20;
  uVar14 = (uint)(uVar12 >> 0x20);
  local_90.buf = buf->ptr_;
  local_90.size = 0;
  local_90.precision = precision;
  if (uVar5 == 0x200000000) {
    uVar18 = local_90.exp10 + uVar14;
    if ((uVar18 ^ 0x7fffffff) < (uint)precision && 0 < (int)uVar18) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_90.precision = uVar18 + precision;
    if (local_90.precision != 0 && SCARRY4(uVar18,precision) == local_90.precision < 0)
    goto LAB_001e0652;
    if (local_90.precision < 0) {
      uVar16 = 0;
      goto LAB_001e0a7b;
    }
    lVar19 = *(long *)(basic_impl_data<void>::power_of_10_64 +
                      ((long)(uVar12 - 0x100000000) >> 0x20) * 8) << (bVar8 & 0x3f);
    uVar16 = uVar22 / 10;
    if (((uVar16 <= lVar19 - uVar16) && (cVar17 = '0', 0x13 < lVar19 + uVar16 * -2)) ||
       ((iVar4 = 0, 99 < uVar22 && (cVar17 = '1', lVar19 - (uVar16 - 10) <= uVar16 - 10)))) {
      local_90.size = 1;
      *local_90.buf = cVar17;
      uVar16 = 1;
      goto LAB_001e0a7b;
    }
  }
  else {
LAB_001e0652:
    local_58 = local_60 - 1;
    uVar22 = uVar22 & local_58;
    plVar20 = (long *)(basic_impl_data<void>::power_of_10_64 + (long)(int)(uVar14 - 1) * 8);
    local_68 = buf;
    do {
      iVar4 = (int)uVar15;
      uVar14 = iVar4 - 1;
      uVar15 = (ulong)uVar14;
      switch(uVar15) {
      case 0:
        cVar17 = (char)uVar16;
        uVar16 = 0;
        goto LAB_001e076d;
      case 1:
        cVar17 = (char)((uVar16 & 0xffffffff) / 10);
        iVar11 = (int)((uVar16 & 0xffffffff) / 10) * 10;
        break;
      case 2:
        cVar17 = (char)((uVar16 & 0xffffffff) / 100);
        iVar11 = (int)((uVar16 & 0xffffffff) / 100) * 100;
        break;
      case 3:
        cVar17 = (char)((uVar16 & 0xffffffff) / 1000);
        iVar11 = (int)((uVar16 & 0xffffffff) / 1000) * 1000;
        break;
      case 4:
        cVar17 = (char)((uVar16 & 0xffffffff) / 10000);
        iVar11 = (int)((uVar16 & 0xffffffff) / 10000) * 10000;
        break;
      case 5:
        uVar12 = uVar16 >> 5 & 0x7ffffff;
        cVar17 = (char)(uVar12 / 0xc35);
        iVar11 = (int)(uVar12 / 0xc35) * 100000;
        break;
      case 6:
        cVar17 = (char)((uVar16 & 0xffffffff) / 1000000);
        iVar11 = (int)((uVar16 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 7:
        cVar17 = (char)((uVar16 & 0xffffffff) / 10000000);
        iVar11 = (int)((uVar16 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 8:
        cVar17 = (char)((uVar16 & 0xffffffff) / 100000000);
        iVar11 = (int)((uVar16 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 9:
        uVar12 = (uVar16 >> 9 & 0x7fffff) * 0x44b83;
        cVar17 = (char)(uVar12 >> 0x27);
        iVar11 = (uint)(uVar12 >> 0x27) * 1000000000;
        break;
      default:
        cVar17 = '\0';
        goto LAB_001e076d;
      }
      uVar16 = (ulong)(uint)((int)uVar16 - iVar11);
LAB_001e076d:
      rVar3 = gen_digits_handler::on_digit
                        (&local_90,cVar17 + '0',*plVar20 << (bVar8 & 0x3f),
                         ((uVar16 & 0xffffffff) << (bVar8 & 0x3f)) + uVar22,1,true);
      divisor = local_60;
      if (rVar3 != more) goto LAB_001e0806;
      plVar20 = plVar20 + -1;
    } while (1 < iVar4);
    error = 1;
    do {
      uVar16 = uVar22 * 10;
      error = error * 10;
      uVar22 = uVar16 & local_58;
      uVar14 = (int)uVar15 - 1;
      uVar15 = (ulong)uVar14;
      rVar3 = gen_digits_handler::on_digit
                        (&local_90,(char)(uVar16 >> (bVar8 & 0x3f)) + '0',divisor,uVar22,error,false
                        );
    } while (rVar3 == more);
LAB_001e0806:
    uVar16 = (ulong)(uint)local_90.size;
    uVar9 = (uint)local_78;
    buf = local_68;
    iVar4 = local_90.precision;
    if (rVar3 != error) {
LAB_001e0a7b:
      iVar11 = uVar14 + local_90.exp10;
      uVar22 = buf->capacity_;
      if (uVar22 < uVar16) {
        (**buf->_vptr_buffer)(buf,uVar16);
        uVar22 = buf->capacity_;
      }
      if (uVar22 < uVar16) {
        uVar16 = uVar22;
      }
      buf->size_ = uVar16;
      goto LAB_001e0aaa;
    }
  }
  iVar11 = (local_90.size - ((int)local_38 + 8)) + uVar14 + 0x15b;
  if ((uVar9 >> 0x12 & 1) == 0) {
    bVar13 = 1 < (uint)local_48 && local_50 == (detail *)0x0;
    uVar16 = (ulong)local_6c;
    pdVar6 = local_40;
  }
  else {
    fVar23 = (float)value;
    uVar14 = (uint)fVar23 & 0x7fffff;
    pdVar6 = (detail *)(ulong)uVar14 + 0x800000;
    if ((uint)fVar23 < 0x800000) {
      pdVar6 = (detail *)(ulong)uVar14;
    }
    uVar16 = 0xffffff6b;
    if ((uint)fVar23 >= 0x800000) {
      uVar16 = (ulong)(((uint)fVar23 >> 0x17) - 0x96);
    }
    bVar13 = 0xffffff < (uint)fVar23 && uVar14 == 0;
  }
  is_predecessor_closer = 0xff;
  if (iVar4 < 0x2ff) {
    is_predecessor_closer = (undefined1)iVar4;
  }
  value_00.e._0_1_ = bVar13;
  value_00.f = uVar16;
  value_00._9_7_ = 0;
  format_dragon(pdVar6,value_00,(bool)is_predecessor_closer,(int)buf,
                (buffer<char> *)&stack0xffffffffffffff5c,
                (int *)CONCAT44(iVar11,in_stack_ffffffffffffff58));
LAB_001e0aaa:
  if ((uVar9 >> 0x14 & 1) == 0 && uVar5 != 0x200000000) {
    sVar21 = buf->size_;
    if (sVar21 != 0) {
      do {
        iVar4 = iVar11 + 1;
        if (buf->ptr_[sVar21 - 1] != '0') {
          uVar5 = buf->capacity_;
          if (uVar5 < sVar21) {
            (**buf->_vptr_buffer)(buf,sVar21);
            uVar5 = buf->capacity_;
          }
          goto LAB_001e0aed;
        }
        sVar21 = sVar21 - 1;
        iVar11 = iVar4;
      } while (sVar21 != 0);
    }
    uVar5 = buf->capacity_;
    sVar21 = 0;
LAB_001e0aed:
    if (uVar5 < sVar21) {
      sVar21 = uVar5;
    }
    buf->size_ = sVar21;
  }
  return iVar11;
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}